

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O3

void Assimp::StandardShapes::MakeCircle
               (ai_real radius,uint tess,
               vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  pointer *ppaVar1;
  iterator iVar2;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar3;
  aiVector3t<float> local_48;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  ai_real local_28;
  uint uStack_24;
  uint uStack_20;
  uint uStack_1c;
  
  local_38 = 0.0;
  if (radius != 0.0 && 2 < tess) {
    local_28 = ABS(radius);
    uStack_24 = in_XMM0_Db & 0x7fffffff;
    uStack_20 = in_XMM0_Dc & 0x7fffffff;
    uStack_1c = in_XMM0_Dd & 0x7fffffff;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (positions,
               (ulong)(tess * 3) +
               ((long)(positions->
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(positions->
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
    local_2c = 6.2831855 / (float)tess;
    local_30 = 1.0;
    fVar3 = 0.0;
    do {
      local_48.z = fVar3 * local_28;
      local_48.y = 0.0;
      local_48.x = local_30 * local_28;
      iVar2._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
                   &local_48);
      }
      else {
        (iVar2._M_current)->z = local_48.z;
        (iVar2._M_current)->x = local_30 * local_28;
        (iVar2._M_current)->y = 0.0;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      local_38 = local_38 + local_2c;
      local_30 = cosf(local_38);
      fVar3 = sinf(local_38);
      local_48.z = local_28 * fVar3;
      local_48.y = 0.0;
      local_48.x = local_28 * local_30;
      iVar2._M_current =
           (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_34 = fVar3;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
                   &local_48);
        iVar2._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
        fVar3 = local_34;
      }
      else {
        (iVar2._M_current)->z = local_48.z;
        (iVar2._M_current)->x = local_28 * local_30;
        (iVar2._M_current)->y = 0.0;
        iVar2._M_current =
             (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
      }
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_48.z = 0.0;
      if (iVar2._M_current ==
          (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_34 = fVar3;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
                   &local_48);
        fVar3 = local_34;
      }
      else {
        (iVar2._M_current)->z = 0.0;
        (iVar2._M_current)->x = 0.0;
        (iVar2._M_current)->y = 0.0;
        ppaVar1 = &(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
    } while (local_38 < 6.2831855);
  }
  return;
}

Assistant:

void StandardShapes::MakeCircle(ai_real radius, unsigned int tess,
    std::vector<aiVector3D>& positions)
{
    // Sorry, a circle with less than 3 segments makes ABSOLUTELY NO SENSE
    if (tess < 3 || !radius)
        return;

    radius = std::fabs(radius);

    // We will need 3 vertices per segment
    positions.reserve(positions.size()+tess*3);

    const ai_real angle_delta = (ai_real)AI_MATH_TWO_PI / tess;
    const ai_real angle_max   = (ai_real)AI_MATH_TWO_PI;

    ai_real s = 1.0; // std::cos(angle == 0);
    ai_real t = 0.0; // std::sin(angle == 0);

    for (ai_real angle = 0.0; angle < angle_max;  )
    {
        positions.push_back(aiVector3D(s * radius,0.0,t * radius));
        angle += angle_delta;
        s = std::cos(angle);
        t = std::sin(angle);
        positions.push_back(aiVector3D(s * radius,0.0,t * radius));

        positions.push_back(aiVector3D(0.0,0.0,0.0));
    }
}